

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::parse_while_statement(Parser *this)

{
  Type TVar1;
  Token *pTVar2;
  AbstractSyntaxNode *pAVar3;
  Type local_394;
  Token local_390;
  int local_338 [4];
  Token local_328;
  Type local_2cc;
  Token local_2c8;
  Type local_26c;
  Token local_268;
  Type local_1fc;
  Token local_1f8;
  stringstream local_1a0 [8];
  stringstream buffer;
  int local_18 [2];
  Parser *local_10;
  Parser *this_local;
  
  pAVar3 = this->current_;
  local_18[1] = 0x2f;
  local_18[0] = 1;
  local_10 = this;
  pTVar2 = forward_token(this,local_18);
  pAVar3 = AbstractSyntaxNode::add_child(pAVar3,(Type *)(local_18 + 1),pTVar2);
  this->current_ = pAVar3;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1fc = kWhile;
  match(&local_1f8,this,&local_1fc);
  Token::~Token(&local_1f8);
  local_26c = kLeftParen;
  match(&local_268,this,&local_26c);
  Token::~Token(&local_268);
  parse_condition(this);
  local_2cc = kRightParen;
  match(&local_2c8,this,&local_2cc);
  Token::~Token(&local_2c8);
  local_338[3] = 0xf;
  match(&local_328,this,(Type *)(local_338 + 3));
  Token::~Token(&local_328);
  pAVar3 = this->current_;
  local_338[2] = 0x26;
  local_338[1] = 1;
  pTVar2 = forward_token(this,local_338 + 1);
  pAVar3 = AbstractSyntaxNode::add_child(pAVar3,(Type *)(local_338 + 2),pTVar2);
  this->current_ = pAVar3;
  while( true ) {
    local_338[0] = 1;
    pTVar2 = forward_token(this,local_338);
    TVar1 = Token::type(pTVar2);
    if (TVar1 == kRightBrace) break;
    parse_statement(this,true);
  }
  local_394 = kRightBrace;
  match(&local_390,this,&local_394);
  Token::~Token(&local_390);
  pAVar3 = AbstractSyntaxNode::parent(this->current_);
  this->current_ = pAVar3;
  pAVar3 = AbstractSyntaxNode::parent(this->current_);
  this->current_ = pAVar3;
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void Parser::parse_while_statement() {
    current_ = current_->add_child(Token::Type::kWhileStatement, forward_token());
    std::stringstream buffer;

    match(Token::Type::kWhile);
    match(Token::Type::kLeftParen);
    parse_condition();
    match(Token::Type::kRightParen);
    match(Token::Type::kLeftBrace);
    current_ = current_->add_child(Token::Type::kStatements, forward_token());
    while (forward_token().type() != Token::Type::kRightBrace) {
        parse_statement();
    }
    match(Token::Type::kRightBrace);
    current_ = current_->parent();

    current_ = current_->parent();
}